

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * __thiscall
doctest::detail::
stringifyBinaryExpr<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (String *__return_storage_ptr__,detail *this,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *lhs,char *op,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *rhs)

{
  String local_98;
  String local_70;
  String local_58;
  String local_40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *local_28;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *rhs_local;
  char *op_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *lhs_local;
  
  local_28 = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)op;
  rhs_local = lhs;
  op_local = (char *)this;
  lhs_local = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
              __return_storage_ptr__;
  toString<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_true>
            (&local_58,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)this);
  String::String(&local_70,(char *)rhs_local);
  doctest::operator+(&local_40,&local_58,&local_70);
  toString<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_true>
            (&local_98,local_28);
  doctest::operator+(__return_storage_ptr__,&local_40,&local_98);
  String::~String(&local_98);
  String::~String(&local_40);
  String::~String(&local_70);
  String::~String(&local_58);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }